

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

void old_swap_nifti_header(nifti_1_header *h,int is_nifti)

{
  ushort *puVar1;
  short *psVar2;
  undefined1 uVar3;
  int iVar4;
  size_t ii;
  long lVar5;
  uchar *cp1;
  
  iVar4 = h->sizeof_hdr;
  *(undefined1 *)&h->sizeof_hdr = *(undefined1 *)((long)&h->sizeof_hdr + 3);
  *(char *)((long)&h->sizeof_hdr + 3) = (char)iVar4;
  puVar1 = (ushort *)((long)&h->sizeof_hdr + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  lVar5 = 0;
  do {
    psVar2 = h->dim + lVar5;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  lVar5 = 0;
  do {
    uVar3 = *(undefined1 *)(h->pixdim + lVar5);
    *(undefined1 *)(h->pixdim + lVar5) = *(undefined1 *)((long)h->pixdim + lVar5 * 4 + 3);
    *(undefined1 *)((long)h->pixdim + lVar5 * 4 + 3) = uVar3;
    puVar1 = (ushort *)((long)h->pixdim + lVar5 * 4 + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  psVar2 = &h->datatype;
  *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
  psVar2 = &h->bitpix;
  *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
  uVar3 = *(undefined1 *)&h->vox_offset;
  *(undefined1 *)&h->vox_offset = *(undefined1 *)((long)&h->vox_offset + 3);
  *(undefined1 *)((long)&h->vox_offset + 3) = uVar3;
  puVar1 = (ushort *)((long)&h->vox_offset + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  uVar3 = *(undefined1 *)&h->cal_max;
  *(undefined1 *)&h->cal_max = *(undefined1 *)((long)&h->cal_max + 3);
  *(undefined1 *)((long)&h->cal_max + 3) = uVar3;
  puVar1 = (ushort *)((long)&h->cal_max + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  uVar3 = *(undefined1 *)&h->cal_min;
  *(undefined1 *)&h->cal_min = *(undefined1 *)((long)&h->cal_min + 3);
  *(undefined1 *)((long)&h->cal_min + 3) = uVar3;
  puVar1 = (ushort *)((long)&h->cal_min + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  if (is_nifti != 0) {
    uVar3 = *(undefined1 *)&h->intent_p1;
    *(undefined1 *)&h->intent_p1 = *(undefined1 *)((long)&h->intent_p1 + 3);
    *(undefined1 *)((long)&h->intent_p1 + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->intent_p1 + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar3 = *(undefined1 *)&h->intent_p2;
    *(undefined1 *)&h->intent_p2 = *(undefined1 *)((long)&h->intent_p2 + 3);
    *(undefined1 *)((long)&h->intent_p2 + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->intent_p2 + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar3 = *(undefined1 *)&h->intent_p3;
    *(undefined1 *)&h->intent_p3 = *(undefined1 *)((long)&h->intent_p3 + 3);
    *(undefined1 *)((long)&h->intent_p3 + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->intent_p3 + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    psVar2 = &h->intent_code;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    psVar2 = &h->slice_start;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    psVar2 = &h->slice_end;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    uVar3 = *(undefined1 *)&h->scl_slope;
    *(undefined1 *)&h->scl_slope = *(undefined1 *)((long)&h->scl_slope + 3);
    *(undefined1 *)((long)&h->scl_slope + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->scl_slope + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar3 = *(undefined1 *)&h->scl_inter;
    *(undefined1 *)&h->scl_inter = *(undefined1 *)((long)&h->scl_inter + 3);
    *(undefined1 *)((long)&h->scl_inter + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->scl_inter + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar3 = *(undefined1 *)&h->slice_duration;
    *(undefined1 *)&h->slice_duration = *(undefined1 *)((long)&h->slice_duration + 3);
    *(undefined1 *)((long)&h->slice_duration + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->slice_duration + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar3 = *(undefined1 *)&h->toffset;
    *(undefined1 *)&h->toffset = *(undefined1 *)((long)&h->toffset + 3);
    *(undefined1 *)((long)&h->toffset + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->toffset + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    psVar2 = &h->qform_code;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    psVar2 = &h->sform_code;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    uVar3 = *(undefined1 *)&h->quatern_b;
    *(undefined1 *)&h->quatern_b = *(undefined1 *)((long)&h->quatern_b + 3);
    *(undefined1 *)((long)&h->quatern_b + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->quatern_b + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar3 = *(undefined1 *)&h->quatern_c;
    *(undefined1 *)&h->quatern_c = *(undefined1 *)((long)&h->quatern_c + 3);
    *(undefined1 *)((long)&h->quatern_c + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->quatern_c + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar3 = *(undefined1 *)&h->quatern_d;
    *(undefined1 *)&h->quatern_d = *(undefined1 *)((long)&h->quatern_d + 3);
    *(undefined1 *)((long)&h->quatern_d + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->quatern_d + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar3 = *(undefined1 *)&h->qoffset_x;
    *(undefined1 *)&h->qoffset_x = *(undefined1 *)((long)&h->qoffset_x + 3);
    *(undefined1 *)((long)&h->qoffset_x + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->qoffset_x + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar3 = *(undefined1 *)&h->qoffset_y;
    *(undefined1 *)&h->qoffset_y = *(undefined1 *)((long)&h->qoffset_y + 3);
    *(undefined1 *)((long)&h->qoffset_y + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->qoffset_y + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar3 = *(undefined1 *)&h->qoffset_z;
    *(undefined1 *)&h->qoffset_z = *(undefined1 *)((long)&h->qoffset_z + 3);
    *(undefined1 *)((long)&h->qoffset_z + 3) = uVar3;
    puVar1 = (ushort *)((long)&h->qoffset_z + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    lVar5 = 0;
    do {
      uVar3 = *(undefined1 *)(h->srow_x + lVar5);
      *(undefined1 *)(h->srow_x + lVar5) = *(undefined1 *)((long)h->srow_x + lVar5 * 4 + 3);
      *(undefined1 *)((long)h->srow_x + lVar5 * 4 + 3) = uVar3;
      puVar1 = (ushort *)((long)h->srow_x + lVar5 * 4 + 1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar5 = 0;
    do {
      uVar3 = *(undefined1 *)(h->srow_y + lVar5);
      *(undefined1 *)(h->srow_y + lVar5) = *(undefined1 *)((long)h->srow_y + lVar5 * 4 + 3);
      *(undefined1 *)((long)h->srow_y + lVar5 * 4 + 3) = uVar3;
      puVar1 = (ushort *)((long)h->srow_y + lVar5 * 4 + 1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar5 = 0;
    do {
      uVar3 = *(undefined1 *)(h->srow_z + lVar5);
      *(undefined1 *)(h->srow_z + lVar5) = *(undefined1 *)((long)h->srow_z + lVar5 * 4 + 3);
      *(undefined1 *)((long)h->srow_z + lVar5 * 4 + 3) = uVar3;
      puVar1 = (ushort *)((long)h->srow_z + lVar5 * 4 + 1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
  }
  return;
}

Assistant:

void nifti_swap_4bytes( size_t n , void *ar )    /* 4 bytes at a time */
{
   register size_t ii ;
   unsigned char * cp0 = (unsigned char *)ar, * cp1, * cp2 ;
   register unsigned char tval ;

   for( ii=0 ; ii < n ; ii++ ){
       cp1 = cp0; cp2 = cp0+3;
       tval = *cp1;  *cp1 = *cp2;  *cp2 = tval;
       cp1++;  cp2--;
       tval = *cp1;  *cp1 = *cp2;  *cp2 = tval;
       cp0 += 4;
   }
   return ;
}